

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  PyTypeObject *pPVar1;
  long *plVar2;
  char *__s1;
  PyObject *pPVar3;
  byte bVar4;
  int iVar5;
  internals *piVar6;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> _Var7;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var8;
  instance *this;
  void **ppvVar9;
  runtime_error *this_00;
  PyObject *tmp;
  handle hVar10;
  long *plVar11;
  anon_union_24_2_63b86169_for_instance_1 *paVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar13;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar14;
  void *src;
  void **local_58;
  handle local_50;
  PyTypeObject *local_48;
  handle local_40;
  
  if (tinfo == (type_info *)0x0) {
    return (handle)(PyObject *)0x0;
  }
  local_58 = (void **)_src;
  if (_src == (void *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar10.m_ptr = (PyObject *)&_Py_NoneStruct;
    goto LAB_0012a05c;
  }
  local_48 = (PyTypeObject *)copy_constructor;
  local_40.m_ptr = parent.m_ptr;
  piVar6 = get_internals();
  pVar13 = std::
           _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range(&(piVar6->registered_instances)._M_h,&local_58);
  for (_Var7._M_cur = (__node_type *)
                      pVar13.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
      (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
      _Var7._M_cur !=
      pVar13.second.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>.
      _M_cur.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>;
      _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt) {
    pPVar1 = *(PyTypeObject **)
              (*(long *)((long)&((_Var7._M_cur)->
                                super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                                ._M_storage._M_storage + 8) + 8);
    pVar14 = all_type_info_get_cache((PyTypeObject *)move_constructor);
    _Var8 = pVar14.first.
            super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
            ._M_cur;
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      all_type_info_populate
                (pPVar1,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                         *)((long)_Var8.
                                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                  ._M_cur + 0x10));
    }
    plVar2 = *(long **)((long)_Var8.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                              ._M_cur + 0x18);
    for (plVar11 = *(long **)((long)_Var8.
                                    super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                    ._M_cur + 0x10); plVar11 != plVar2; plVar11 = plVar11 + 1) {
      if (*plVar11 != 0) {
        __s1 = *(char **)(*(long *)(*plVar11 + 8) + 8);
        if ((__s1 == *(char **)(tinfo->cpptype + 8)) ||
           ((*__s1 != '*' && (iVar5 = strcmp(__s1,*(char **)(tinfo->cpptype + 8)), iVar5 == 0)))) {
          pPVar3 = *(PyObject **)
                    ((long)&((_Var7._M_cur)->
                            super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                            ._M_storage._M_storage + 8);
          if (pPVar3 == (PyObject *)0x0) {
            return (handle)(PyObject *)0x0;
          }
          pPVar3->ob_refcnt = pPVar3->ob_refcnt + 1;
          return (handle)pPVar3;
        }
      }
    }
  }
  this = (instance *)(*tinfo->type->tp_alloc)(tinfo->type,0);
  instance::allocate_layout(this);
  this->field_0x30 = this->field_0x30 & 0xfe;
  pPVar1 = (this->ob_base).ob_type;
  local_50.m_ptr = (PyObject *)this;
  pVar14 = all_type_info_get_cache((PyTypeObject *)move_constructor);
  if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (pPVar1,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)((long)pVar14.first.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                ._M_cur.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                         + 0x10));
  }
  paVar12 = &this->field_1;
  if ((this->field_0x30 & 2) == 0) {
    paVar12 = (anon_union_24_2_63b86169_for_instance_1 *)(paVar12->nonsimple).values_and_holders;
  }
  switch(policy) {
  case automatic:
  case take_ownership:
    ppvVar9 = local_58;
    break;
  case automatic_reference:
  case reference:
    (paVar12->nonsimple).values_and_holders = local_58;
    bVar4 = this->field_0x30 & 0xfe;
    goto LAB_0012a045;
  case copy:
    if (local_48 == (PyTypeObject *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"return_value_policy = copy, but the object is non-copyable!");
      goto LAB_0012a0d2;
    }
    ppvVar9 = (void **)(*(code *)local_48)(local_58);
    break;
  case move:
    if (((PyTypeObject *)move_constructor == (PyTypeObject *)0x0) &&
       (move_constructor = (_func_void_ptr_void_ptr *)local_48, local_48 == (PyTypeObject *)0x0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "return_value_policy = move, but the object is neither movable nor copyable!");
      goto LAB_0012a0d2;
    }
    ppvVar9 = (void **)(*move_constructor)(local_58);
    break;
  case reference_internal:
    (paVar12->nonsimple).values_and_holders = local_58;
    this->field_0x30 = this->field_0x30 & 0xfe;
    keep_alive_impl(local_50,local_40);
    goto LAB_0012a049;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unhandled return_value_policy: should not happen!");
LAB_0012a0d2:
    *(undefined ***)this_00 = &PTR__runtime_error_001abe98;
    __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (paVar12->nonsimple).values_and_holders = ppvVar9;
  bVar4 = this->field_0x30 | 1;
LAB_0012a045:
  this->field_0x30 = bVar4;
LAB_0012a049:
  (*tinfo->init_instance)(this,existing_holder);
  hVar10.m_ptr = local_50.m_ptr;
LAB_0012a05c:
  local_50.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_50);
  return (handle)hVar10.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        auto it_instances = get_internals().registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            for (auto instance_type : detail::all_type_info(Py_TYPE(it_i->second))) {
                if (instance_type && same_type(*instance_type->cpptype, *tinfo->cpptype))
                    return handle((PyObject *) it_i->second).inc_ref();
            }
        }

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = copy, but the "
                                     "object is non-copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = move, but the "
                                     "object is neither movable nor copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }